

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O0

bool __thiscall Tank::createServer(Tank *this)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int *piVar4;
  ostream *poVar5;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  __cxx11 local_40 [4];
  uint __i;
  int local_1c;
  Tank *pTStack_18;
  int myPortInt;
  Tank *this_local;
  
  local_1c = this->vector_order + 10000;
  pTStack_18 = this;
  std::__cxx11::to_string(local_40,local_1c);
  std::__cxx11::string::operator=((string *)&this->myPort,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  memset(&this->myhints,0,0x30);
  (this->myhints).ai_socktype = 1;
  (this->myhints).ai_family = 2;
  (this->myhints).ai_flags = 1;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    (this->master).fds_bits[__arr._4_4_] = 0;
  }
  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
    (this->tmpSet).fds_bits[__arr_1._4_4_] = 0;
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = getaddrinfo((char *)0x0,pcVar2,(addrinfo *)&this->myhints,(addrinfo **)&this->myaddr);
  if (iVar1 == 0) {
    iVar1 = socket(this->myaddr->ai_family,this->myaddr->ai_socktype,this->myaddr->ai_protocol);
    this->listener = iVar1;
    if (this->listener == -1) {
      uVar3 = std::__cxx11::string::c_str();
      printf("Cannot create new socket%s\n",uVar3);
      this_local._7_1_ = false;
    }
    else {
      this->fdMax = this->listener;
      iVar1 = this->listener / 0x40;
      (this->master).fds_bits[iVar1] =
           1L << ((byte)((long)this->listener % 0x40) & 0x3f) | (this->master).fds_bits[iVar1];
      iVar1 = bind(this->listener,(sockaddr *)this->myaddr->ai_addr,this->myaddr->ai_addrlen);
      if (iVar1 == 0) {
        iVar1 = listen(this->listener,0xf);
        if (iVar1 != 0) {
          printf("Cannot listen on socket");
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          if (iVar1 == 9) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"bad descriptor");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            return false;
          }
          if (iVar1 == 0x58) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"not a socket");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            return false;
          }
          if (iVar1 == 0x5f) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"not a supported type");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            return false;
          }
          if (iVar1 == 0x62) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Address is in use");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            return false;
          }
        }
        freeaddrinfo((addrinfo *)this->myaddr);
        poVar5 = std::operator<<((ostream *)&std::cout,"TANK: ");
        pcVar2 = "GREEN_";
        if (this->color == RED) {
          pcVar2 = "RED_";
        }
        poVar5 = std::operator<<(poVar5,pcVar2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->vector_order);
        poVar5 = std::operator<<(poVar5," Spawned and listening on ");
        poVar5 = std::operator<<(poVar5,(string *)&this->myPort);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this->fdMax = this->listener;
        this_local._7_1_ = true;
      }
      else {
        printf("Cannot bind socket to address\n");
        this_local._7_1_ = false;
      }
    }
  }
  else {
    printf("Cannot get server IP address\n");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Tank::createServer()
{

        int myPortInt = 10000;
        myPortInt += this->vector_order; // + order in vector of tanks in world
        myPort = std::to_string(myPortInt);

        memset(&myhints, 0, sizeof(struct addrinfo));
        myhints.ai_socktype = SOCK_STREAM;
        myhints.ai_family = AF_INET;
        myhints.ai_flags = AI_PASSIVE;

        FD_ZERO(&master);
        FD_ZERO (&tmpSet);

        if (getaddrinfo(NULL, myPort.c_str(), &myhints, &myaddr) != 0) {
            printf("Cannot get server IP address\n");
            return false;
        }

        // Create listener socket
        listener = socket(myaddr->ai_family, myaddr->ai_socktype, myaddr->ai_protocol);
        if (listener == -1) {
            printf("Cannot create new socket%s\n", myPort.c_str());
            return false;
        }

        fdMax = listener;
        FD_SET(listener, &master);

        if (bind(listener, myaddr->ai_addr, myaddr->ai_addrlen) != 0) {
                printf("Cannot bind socket to address\n");
                return false;
            }


        if (listen(listener, 15) != 0) {
           printf("Cannot listen on socket");
	   switch(errno){
        	case EADDRINUSE:
            		std::cerr << "Address is in use" << std::endl;
            		return false;
       	 	case EBADF:
            		std::cerr << "bad descriptor" << std::endl;
            		return false;
        	case ENOTSOCK:
            		std::cerr << "not a socket" << std::endl;
            		return false;
        	case EOPNOTSUPP:
            		std::cerr << "not a supported type" << std::endl;
		        return false;
        	}
        }

        freeaddrinfo(myaddr);
        std::cout << "TANK: " << (this->color == RED ? "RED_" : "GREEN_") << vector_order << " Spawned and listening on " << myPort << std::endl;
        fdMax = listener;
        return true;
}